

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

void Ivy_ManSeqFindCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSize)

{
  Ivy_Obj_t *pIVar1;
  int iVar2;
  int iVar3;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0xb9,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  if ((*(uint *)&pRoot->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0xba,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  pIVar1 = pRoot->pFanin0;
  if ((pIVar1 == (Ivy_Obj_t *)0x0) || (*(int *)((ulong)pIVar1 & 0xfffffffffffffffe) == 0)) {
    __assert_fail("Ivy_ObjFaninId0(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0xbb,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  if ((pRoot->pFanin1 != (Ivy_Obj_t *)0x0) &&
     (*(int *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) != 0)) {
    iVar2 = 0;
    vFront->nSize = 0;
    iVar3 = 0;
    if (pIVar1 != (Ivy_Obj_t *)0x0) {
      iVar3 = *(int *)((ulong)pIVar1 & 0xfffffffffffffffe) << 8;
    }
    Vec_IntPush(vFront,iVar3);
    if (pRoot->pFanin1 != (Ivy_Obj_t *)0x0) {
      iVar2 = *(int *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) << 8;
    }
    Vec_IntPush(vFront,iVar2);
    vInside->nSize = 0;
    Vec_IntPush(vInside,pRoot->Id << 8);
    iVar2 = 0;
    iVar3 = 0;
    if (pRoot->pFanin0 != (Ivy_Obj_t *)0x0) {
      iVar3 = *(int *)((ulong)pRoot->pFanin0 & 0xfffffffffffffffe) << 8;
    }
    Vec_IntPush(vInside,iVar3);
    if (pRoot->pFanin1 != (Ivy_Obj_t *)0x0) {
      iVar2 = *(int *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) << 8;
    }
    Vec_IntPush(vInside,iVar2);
    do {
      iVar2 = Ivy_ManSeqFindCut_int(p,vFront,vInside,nSize);
    } while (iVar2 != 0);
    if (vFront->nSize <= nSize) {
      return;
    }
    __assert_fail("Vec_IntSize(vFront) <= nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0xcb,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  __assert_fail("Ivy_ObjFaninId1(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                ,0xbc,
                "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

void Ivy_ManSeqFindCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSize )
{
    assert( !Ivy_IsComplement(pRoot) );
    assert( Ivy_ObjIsNode(pRoot) );
    assert( Ivy_ObjFaninId0(pRoot) );
    assert( Ivy_ObjFaninId1(pRoot) );

    // start the cut 
    Vec_IntClear( vFront );
    Vec_IntPush( vFront, Ivy_LeafCreate(Ivy_ObjFaninId0(pRoot), 0) );
    Vec_IntPush( vFront, Ivy_LeafCreate(Ivy_ObjFaninId1(pRoot), 0) );

    // start the visited nodes
    Vec_IntClear( vInside );
    Vec_IntPush( vInside, Ivy_LeafCreate(pRoot->Id, 0) );
    Vec_IntPush( vInside, Ivy_LeafCreate(Ivy_ObjFaninId0(pRoot), 0) );
    Vec_IntPush( vInside, Ivy_LeafCreate(Ivy_ObjFaninId1(pRoot), 0) );

    // compute the cut
    while ( Ivy_ManSeqFindCut_int( p, vFront, vInside, nSize ) );
    assert( Vec_IntSize(vFront) <= nSize );
}